

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void AddLookup(nodeclass *Class,nodemeta *m,array *List)

{
  nodemeta *pnVar1;
  uint uVar2;
  nodemetalookup Lookup;
  bool_t Found;
  ulong local_38;
  nodemeta *local_30;
  long local_28;
  
  local_38 = (ulong)(*(uint *)m >> 8);
  local_30 = (nodemeta *)0x0;
  if (List == (array *)0x0) {
    __assert_fail("&(*List)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x40f,"void AddLookup(nodeclass *, const nodemeta *, array *)");
  }
  ArrayFindEx(List,List->_Used >> 4,0x10,&local_38,CmpLookup,(void *)0x0,&local_28);
  if ((local_28 == 0) || (*(char *)m == '-')) {
    if ((char)*(uint *)m == 'X') {
      for (; Class != (nodeclass *)0x0; Class = Class->ParentClass) {
        local_30 = Class->Meta;
        if (local_30 != (nodemeta *)0x0) {
          uVar2 = *(uint *)local_30;
          while ((uVar2 & 0xff) != 0) {
            if (((uVar2 & 0xff) == 0x26) && ((uVar2 ^ *(uint *)m) < 0x100)) goto LAB_0011c57d;
            pnVar1 = local_30 + 1;
            local_30 = local_30 + 1;
            uVar2 = *(uint *)pnVar1;
          }
        }
      }
      local_30 = (nodemeta *)0x0;
LAB_0011c57d:
      if (local_30 == (nodemeta *)0x0) {
        __assert_fail("Lookup.Meta",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x415,"void AddLookup(nodeclass *, const nodemeta *, array *)");
      }
      ArrayAddEx(List,List->_Used >> 4,0x10,&local_38,CmpLookup,(void *)0x0,0);
    }
    local_30 = m;
    ArrayAddEx(List,List->_Used >> 4,0x10,&local_38,CmpLookup,&local_38,0);
  }
  return;
}

Assistant:

static NOINLINE void AddLookup(nodeclass* Class, const nodemeta* m, array* List)
{
    bool_t Found;
    nodemetalookup Lookup;
    Lookup.Id = m->Id;
    Lookup.Meta = NULL;
    ArrayFind(List,nodemetalookup,&Lookup,CmpLookup,NULL,&Found);
    if (!Found || m->Meta == META_PARAM_EVENT)
    {
        if ((m->Meta & META_MODE_MASK)==META_MODE_DATA && (m->Meta & TYPE_MASK)==TYPE_BOOL_BIT)
        {
            Lookup.Meta = BitLookup(Class,m->Id);
            assert(Lookup.Meta);
            if (!Lookup.Meta)
                return;
            ArrayAdd(List,nodemetalookup,&Lookup,CmpLookup,NULL,0);
        }
        Lookup.Meta = m;
        ArrayAdd(List,nodemetalookup,&Lookup,CmpLookup,&Lookup,0);
    }
}